

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O3

void read_32_rgba_8888_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  lVar2 = al_fread(f,buf,(long)(length * 4));
  memset(buf + lVar2,0,length * 4 - lVar2);
  if (0 < length) {
    uVar3 = 0;
    do {
      uVar1 = *(uint *)(buf + uVar3 * 4);
      *(uint *)(data + uVar3 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if ((premul) && (uVar4 = uVar1 & 0xff, uVar4 != 0xff)) {
        data[uVar3 * 4] = (char)(((int)(char)(uVar1 >> 0x18) * uVar4) / 0xff);
        data[uVar3 * 4 + 1] = (char)(((int)data[uVar3 * 4 + 1] * uVar4) / 0xff);
        data[uVar3 * 4 + 2] = (char)(((int)data[uVar3 * 4 + 2] * uVar4) / 0xff);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

static void read_32_rgba_8888_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = length * 4;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   for (i = 0; i < length; i++) {
      uint32_t pixel = read_32le(buf + i*4);
      uint32_t a = (pixel & 0x000000FFU);
      data32[i] = ALLEGRO_CONVERT_RGBA_8888_TO_ABGR_8888_LE(pixel);

      if (premul && a != 255) {
         data[i*4]   = data[i*4] * a / 255;
         data[i*4+1] = data[i*4+1] * a / 255;
         data[i*4+2] = data[i*4+2] * a / 255;
      }
   }
}